

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_setfield(lua_State *L,int idx,char *k)

{
  TValue *pTVar1;
  size_t lenx;
  GCstr *pGVar2;
  TValue *pTVar3;
  TValue key;
  cTValue local_20;
  
  pTVar1 = index2adr(L,idx);
  lenx = strlen(k);
  pGVar2 = lj_str_new(L,k,lenx);
  local_20.u64 = (ulong)pGVar2 | 0xfffd800000000000;
  pTVar3 = lj_meta_tset(L,pTVar1,&local_20);
  pTVar1 = L->top;
  if (pTVar3 == (TValue *)0x0) {
    pTVar1[2] = pTVar1[-5];
    L->top = pTVar1 + 3;
    lj_vm_call(L,pTVar1,1);
    L->top = L->top + -3;
  }
  else {
    L->top = pTVar1 + -1;
    *pTVar3 = pTVar1[-1];
  }
  return;
}

Assistant:

LUA_API void lua_setfield(lua_State *L, int idx, const char *k)
{
  TValue *o;
  TValue key;
  cTValue *t = index2adr_check(L, idx);
  lj_checkapi_slot(1);
  setstrV(L, &key, lj_str_newz(L, k));
  o = lj_meta_tset(L, t, &key);
  if (o) {
    /* NOBARRIER: lj_meta_tset ensures the table is not black. */
    copyTV(L, o, --L->top);
  } else {
    TValue *base = L->top;
    copyTV(L, base+2, base-3-2*LJ_FR2);
    L->top = base+3;
    lj_vm_call(L, base, 0+1);
    L->top -= 2+LJ_FR2;
  }
}